

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_buffer.h
# Opt level: O3

bool __thiscall
draco::DecoderBuffer::DecodeLeastSignificantBits32
          (DecoderBuffer *this,uint32_t nbits,uint32_t *out_value)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  size_t sVar4;
  uint uVar5;
  byte *pbVar6;
  
  if (this->bit_mode_ != true) {
    return false;
  }
  bVar1 = false;
  uVar2 = 0;
  if (nbits < 0x21) {
    if (nbits != 0) {
      sVar4 = (this->bit_decoder_).bit_offset_;
      uVar3 = 0;
      uVar2 = 0;
      do {
        pbVar6 = (this->bit_decoder_).bit_buffer_ + (sVar4 >> 3);
        if (pbVar6 < (this->bit_decoder_).bit_buffer_end_) {
          uVar5 = (uint)((*pbVar6 >> ((uint)sVar4 & 7) & 1) != 0);
          sVar4 = sVar4 + 1;
          (this->bit_decoder_).bit_offset_ = sVar4;
        }
        else {
          uVar5 = 0;
        }
        uVar2 = uVar2 | uVar5 << ((byte)uVar3 & 0x1f);
        uVar3 = uVar3 + 1;
      } while (nbits != uVar3);
    }
    *out_value = uVar2;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool DecodeLeastSignificantBits32(uint32_t nbits, uint32_t *out_value) {
    if (!bit_decoder_active()) {
      return false;
    }
    return bit_decoder_.GetBits(nbits, out_value);
  }